

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shm_writer.cpp
# Opt level: O1

void __thiscall diffusion::ShmWriter::~ShmWriter(ShmWriter *this)

{
  int __fd;
  mapped_region *__ptr;
  pointer pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  
  (this->super_Writer)._vptr_Writer = (_func_int **)&PTR_write_00109c70;
  boost::interprocess::shared_memory_object::remove((this->shm_name_)._M_dataplus._M_p);
  __ptr = (this->shm_region_)._M_t.
          super___uniq_ptr_impl<boost::interprocess::mapped_region,_std::default_delete<boost::interprocess::mapped_region>_>
          ._M_t.
          super__Tuple_impl<0UL,_boost::interprocess::mapped_region_*,_std::default_delete<boost::interprocess::mapped_region>_>
          .super__Head_base<0UL,_boost::interprocess::mapped_region_*,_false>._M_head_impl;
  if (__ptr != (mapped_region *)0x0) {
    std::default_delete<boost::interprocess::mapped_region>::operator()
              ((default_delete<boost::interprocess::mapped_region> *)&this->shm_region_,__ptr);
  }
  (this->shm_region_)._M_t.
  super___uniq_ptr_impl<boost::interprocess::mapped_region,_std::default_delete<boost::interprocess::mapped_region>_>
  ._M_t.
  super__Tuple_impl<0UL,_boost::interprocess::mapped_region_*,_std::default_delete<boost::interprocess::mapped_region>_>
  .super__Head_base<0UL,_boost::interprocess::mapped_region_*,_false>._M_head_impl =
       (mapped_region *)0x0;
  __fd = (this->shm_object_).m_handle;
  if (__fd != -1) {
    close(__fd);
    (this->shm_object_).m_handle = -1;
  }
  pcVar1 = (this->shm_object_).m_filename._M_dataplus._M_p;
  paVar2 = &(this->shm_object_).m_filename.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
  }
  pcVar1 = (this->shm_name_)._M_dataplus._M_p;
  paVar2 = &(this->shm_name_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

ShmWriter::~ShmWriter() {
    boost::interprocess::shared_memory_object::remove(shm_name_.c_str());
}